

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate_stream.cpp
# Opt level: O3

string * __thiscall
boost::deflate::inflate_stream_test::compress_abi_cxx11_
          (string *__return_storage_ptr__,inflate_stream_test *this,string_view *in,int level,
          int windowBits,wrap wrap,int memLevel,int strategy)

{
  Bytef *sourceLen;
  int iVar1;
  uLong uVar2;
  logic_error *plVar3;
  undefined7 in_register_00000089;
  z_stream zs;
  
  if (windowBits == 2) {
    level = level + 0x10;
  }
  else if (windowBits == 0) {
    level = -level;
  }
  zs.adler = 0;
  zs.reserved = 0;
  zs.opaque = (voidpf)0x0;
  zs.data_type = 0;
  zs._92_4_ = 0;
  zs.zalloc = (alloc_func)0x0;
  zs.zfree = (free_func)0x0;
  zs.msg = (char *)0x0;
  zs.state = (internal_state *)0x0;
  zs.avail_out = 0;
  zs._36_4_ = 0;
  zs.total_out = 0;
  zs.total_in = 0;
  zs.next_out = (Bytef *)0x0;
  zs.next_in = (Bytef *)0x0;
  zs.avail_in = 0;
  zs._12_4_ = 0;
  iVar1 = deflateInit2_(&zs,(int)in,8,level,(int)CONCAT71(in_register_00000089,wrap),memLevel,
                        "1.2.11",0x70);
  if (iVar1 == 0) {
    zs.next_in = (Bytef *)(this->zlib_decompressor).super_IDecompressor._vptr_IDecompressor;
    sourceLen = (this->zlib_decompressor).zs.next_in;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    zs.avail_in = (uInt)sourceLen;
    uVar2 = deflateBound(&zs,(uLong)sourceLen);
    std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)uVar2);
    zs.next_in = (Bytef *)(this->zlib_decompressor).super_IDecompressor._vptr_IDecompressor;
    zs.avail_in = *(uInt *)&(this->zlib_decompressor).zs.next_in;
    zs.next_out = (Bytef *)(__return_storage_ptr__->_M_dataplus)._M_p;
    zs.avail_out = (uInt)__return_storage_ptr__->_M_string_length;
    iVar1 = ::deflate(&zs,3);
    if (iVar1 == 0) {
      std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)zs.total_out);
      deflateEnd(&zs);
      return __return_storage_ptr__;
    }
    plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar3,"deflate failed");
    __cxa_throw(plVar3,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(plVar3,"deflateInit2 failed");
  __cxa_throw(plVar3,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

static
    std::string compress(
        string_view const& in,
        int level,                  // 0=none, 1..9, -1=default
        int windowBits,             // 9..15
        wrap wrap,                  // stream wrapper
        int memLevel,               // 1..9 (8=default)
        int strategy)               // e.g. Z_DEFAULT_STRATEGY
    {
        switch (wrap) {
            case boost::deflate::wrap::none:
                windowBits *= -1;
                break;
            case boost::deflate::wrap::gzip:
                windowBits += 16;
            default:
                ;
        }
        z_stream zs;
        memset(&zs, 0, sizeof(zs));
        int result = deflateInit2(
            &zs,
            level,
            Z_DEFLATED,
            windowBits,
            memLevel,
            strategy);
        if(result != Z_OK)
            throw std::logic_error{"deflateInit2 failed"};
        zs.next_in = (Bytef*)in.data();
        zs.avail_in = static_cast<uInt>(in.size());
        std::string out;
        out.resize(deflateBound(&zs,
            static_cast<uLong>(in.size())));
        zs.next_in = (Bytef*)in.data();
        zs.avail_in = static_cast<uInt>(in.size());
        zs.next_out = (Bytef*)&out[0];
        zs.avail_out = static_cast<uInt>(out.size());
        result = ::deflate(&zs, Z_FULL_FLUSH);
        if(result != Z_OK)
            throw std::logic_error("deflate failed");
        out.resize(zs.total_out);
        deflateEnd(&zs);
        return out;
    }